

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

void __thiscall
testing::internal::ElementsAreMatcherImpl<std::vector<int,std::allocator<int>>const&>::
ElementsAreMatcherImpl<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
          (ElementsAreMatcherImpl<std::vector<int,std::allocator<int>>const&> *this,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> first,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> last)

{
  MatcherBase<const_int_&> MStack_38;
  
  *(undefined ***)this = &PTR__ElementsAreMatcherImpl_00565bf0;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  if (first._M_current != last._M_current) {
    do {
      Matcher<const_int_&>::Matcher((Matcher<const_int_&> *)&MStack_38,first._M_current);
      std::vector<testing::Matcher<int_const&>,std::allocator<testing::Matcher<int_const&>>>::
      emplace_back<testing::Matcher<int_const&>>
                ((vector<testing::Matcher<int_const&>,std::allocator<testing::Matcher<int_const&>>>
                  *)(this + 8),(Matcher<const_int_&> *)&MStack_38);
      first._M_current = first._M_current + 1;
      MatcherBase<const_int_&>::~MatcherBase(&MStack_38);
    } while (first._M_current != last._M_current);
  }
  return;
}

Assistant:

ElementsAreMatcherImpl(InputIter first, InputIter last) {
    while (first != last) {
      matchers_.push_back(MatcherCast<const Element&>(*first++));
    }
  }